

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testinplacetext.cpp
# Opt level: O1

int inplace_feedback_left_proc(Am_Object *self)

{
  char cVar1;
  int iVar2;
  Am_Value *this;
  Am_Object operates_on;
  int x;
  int y;
  Am_Object AStack_38;
  Am_Object local_30;
  int local_28;
  int local_24;
  
  iVar2 = 0;
  Am_Object::Get_Object((ushort)&local_30,(ulong)self);
  cVar1 = Am_Object::Valid();
  if (cVar1 != '\0') {
    Am_Object::Get_Object((ushort)&AStack_38,(ulong)self);
    Am_Translate_Coordinates(&local_30,0,0,&AStack_38,&local_28,&local_24);
    Am_Object::~Am_Object(&AStack_38);
    this = (Am_Value *)Am_Object::Get((ushort)self,(ulong)Am_TEXT_X_OFFSET);
    iVar2 = Am_Value::operator_cast_to_int(this);
    iVar2 = iVar2 + local_28;
  }
  Am_Object::~Am_Object(&local_30);
  return iVar2;
}

Assistant:

Am_Define_Formula(int, inplace_feedback_left)
{
  Am_Object operates_on = self.Get_Object(Am_OPERATES_ON);
  if (operates_on.Valid()) {
    int x, y;
    Am_Translate_Coordinates(operates_on, 0, 0, self.Get_Owner(), x, y);
    return x + (int)self.Get(Am_TEXT_X_OFFSET);
  }
  return 0;
}